

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O1

wchar_t ranged_damage(player *p,monster_conflict *mon,object *missile,object *launcher,wchar_t b,
                     wchar_t s,wchar_t sleeping_bonus,uint32_t *msg_type,_Bool *marksman,
                     wchar_t tries)

{
  _Bool _Var1;
  int16_t iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  ulong uVar6;
  int iVar7;
  uint num;
  uint uVar8;
  int iVar9;
  int local_48;
  
  if (launcher == (object *)0x0) {
    wVar3 = L'\x01';
  }
  else {
    wVar3 = (p->state).ammo_mult;
  }
  iVar7 = (((uint)missile->ds + (uint)missile->ds * 4) * 2 + 10 >> 1) * wVar3;
  num = (uint)missile->dd;
  if (b == L'\0') {
    if (s != L'\0') {
      wVar3 = slays[s].multiplier;
      goto LAB_001b32e6;
    }
    iVar7 = iVar7 * 10;
    local_48 = 0;
  }
  else {
    wVar3 = get_monster_brand_multiplier(mon,brands + b);
LAB_001b32e6:
    iVar7 = iVar7 * wVar3;
    local_48 = wVar3 + L'\xfffffff6';
  }
  wVar3 = object_to_dam(missile);
  if (launcher == (object *)0x0) {
    _Var1 = flag_has_dbg(missile->flags,6,0x29,"missile->flags","OF_THROWING");
    if (_Var1) {
      wVar3 = wVar3 + (p->state).to_d;
    }
  }
  else {
    wVar4 = object_to_dam(launcher);
    wVar3 = wVar4 + wVar3 + (p->state).to_d;
  }
  wVar4 = L'\x96';
  if (wVar3 < L'\x96') {
    wVar4 = wVar3;
  }
  uVar6 = 0xffffff6a;
  if (L'\xffffff6a' < wVar4) {
    uVar6 = (ulong)(uint)wVar4;
  }
  if (wVar3 < L'\0') {
    iVar9 = 0;
    if ((ulong)(uint)-(int)uVar6 - 0x1f < 0x78) goto LAB_001b33a4;
    uVar8 = -(uint)""[(uint)-(int)uVar6];
  }
  else {
    uVar8 = (uint)""[uVar6];
  }
  iVar9 = (uVar8 + 100) * iVar7;
LAB_001b33a4:
  uVar5 = Rand_div(10000);
  if (launcher == (object *)0x0) {
    _Var1 = flag_has_dbg(missile->flags,6,0x29,"missile->flags","OF_THROWING");
    if ((_Var1) && (_Var1 = tval_is_ammo(missile), !_Var1)) {
      _Var1 = flag_has_dbg(missile->flags,6,0x2a,"missile->flags","OF_PERFECT_BALANCE");
      wVar3 = critical_shot(p,mon,missile,(object *)0x0,sleeping_bonus,msg_type,marksman,tries);
      iVar2 = object_weight_one(missile);
      num = (int)(short)(iVar2 / 0xc + 2) * (wVar3 + (num << _Var1));
    }
  }
  else {
    wVar3 = critical_shot(p,mon,missile,launcher,sleeping_bonus,msg_type,marksman,tries);
    num = num + wVar3;
  }
  iVar7 = iVar9 * 2 + -10000;
  iVar7 = damroll(num,(uint)((int)uVar5 < iVar7 % 10000) + iVar7 / 10000);
  return iVar7 + local_48;
}

Assistant:

static int ranged_damage(struct player *p, const struct monster *mon,
						 struct object *missile, struct object *launcher,
						 int b, int s, int sleeping_bonus, uint32_t *msg_type,
						 bool *marksman, int tries)
{
	int mult = (launcher ? p->state.ammo_mult : 1);
	int dice = missile->dd;
	int sides, deadliness, dmg, add = 0;
	bool extra;

	/* Get the average value of a single damage die. (x10) */
	int die_average = (10 * (missile->ds + 1)) / 2;

	/* Apply the launcher multiplier. */
	die_average *= mult;

	/* Adjust the average for slays and brands. (10x inflation) */
	if (b) {
		int bmult = get_monster_brand_multiplier(mon, &brands[b]);

		die_average *= bmult;
		add = bmult - 10;
	} else if (s) {
		die_average *= slays[s].multiplier;
		add = slays[s].multiplier - 10;
	} else {
		die_average *= 10;
	}

	/* Apply deadliness to average. (100x inflation) */
	deadliness = object_to_dam(missile);
	if (launcher) {
		deadliness += object_to_dam(launcher) + p->state.to_d;
	} else if (of_has(missile->flags, OF_THROWING)) {
		deadliness += p->state.to_d;
	}
	apply_deadliness(&die_average, MIN(deadliness, 150));

	/* Calculate the actual number of sides to each die. */
	sides = (2 * die_average) - 10000;
	extra = randint0(10000) < (sides % 10000);
	sides /= 10000;
	sides += (extra ? 1 : 0);

	/* Get number of critical dice - only for suitable objects */
	if (launcher) {
		dice += critical_shot(p, mon, missile, launcher, sleeping_bonus,
							  msg_type, marksman, tries);
	} else if (of_has(missile->flags, OF_THROWING) && !tval_is_ammo(missile)) {
		/* Perfectly balanced weapons do even more damage. */
		if (of_has(missile->flags, OF_PERFECT_BALANCE)) {
			dice *= 2;
		}

		dice += critical_shot(p, mon, missile, NULL, sleeping_bonus,
							  msg_type, marksman, tries);

		/* Multiply the number of damage dice by the throwing weapon
		 * multiplier.  This is not the prettiest equation,
		 * but it does at least try to keep throwing weapons competitive. */
		dice *= 2 + object_weight_one(missile) / 12;
	}

	/* Roll out the damage. */
	dmg = damroll(dice, sides);

	/* Apply any special additions to damage. */
	dmg += add;

	return dmg;
}